

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O0

int nn_rep_recv(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  char *pcVar2;
  size_t in_RSI;
  nn_chunkref *in_RDI;
  nn_rep *rep;
  int rc;
  nn_msg *in_stack_00000040;
  nn_sockbase *in_stack_00000048;
  FILE *__stream;
  nn_chunkref *self_00;
  uint in_stack_ffffffffffffffe0;
  int local_4;
  
  self_00 = in_RDI;
  if (in_RDI == (nn_chunkref *)0x0) {
    self_00 = (nn_chunkref *)0x0;
  }
  if (((undefined1  [32])self_00[0xd].u & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
    nn_chunkref_term(self_00);
    *(uint *)((long)&self_00[0xd].u + 0x10) = *(uint *)((long)&self_00[0xd].u + 0x10) & 0xfffffffe;
  }
  iVar1 = nn_xrep_recv(in_stack_00000048,in_stack_00000040);
  if (iVar1 == -0xb) {
    local_4 = -0xb;
  }
  else {
    if (iVar1 != 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar2 = nn_err_strerror((int)((ulong)_stderr >> 0x20));
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/rep.c"
              ,0x84);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_chunkref_mv((nn_chunkref *)(ulong)in_stack_ffffffffffffffe0,self_00);
    nn_chunkref_init(in_RDI,in_RSI);
    *(uint *)((long)&self_00[0xd].u + 0x10) = *(uint *)((long)&self_00[0xd].u + 0x10) | 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nn_rep_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_rep *rep;

    rep = nn_cont (self, struct nn_rep, xrep.sockbase);

    /*  If a request is already being processed, cancel it. */
    if (nn_slow (rep->flags & NN_REP_INPROGRESS)) {
        nn_chunkref_term (&rep->backtrace);
        rep->flags &= ~NN_REP_INPROGRESS;
    }

    /*  Receive the request. */
    rc = nn_xrep_recv (&rep->xrep.sockbase, msg);
    if (nn_slow (rc == -EAGAIN))
        return -EAGAIN;
    errnum_assert (rc == 0, -rc);

    /*  Store the backtrace. */
    nn_chunkref_mv (&rep->backtrace, &msg->sphdr);
    nn_chunkref_init (&msg->sphdr, 0);
    rep->flags |= NN_REP_INPROGRESS;

    return 0;
}